

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-create.cc
# Opt level: O3

void __thiscall ImageProvider::ImageProvider(ImageProvider *this,string *color_space,string *filter)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  pointer pcVar1;
  int iVar2;
  int local_3c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  QPDFObjectHandle::StreamDataProvider::StreamDataProvider(&this->super_StreamDataProvider,false);
  *(undefined ***)this = &PTR__ImageProvider_0010bb40;
  this->width = 400;
  this->stripe_height = 0x50;
  local_38 = &(this->color_space).field_2;
  (this->color_space)._M_dataplus._M_p = (pointer)local_38;
  pcVar1 = (color_space->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->color_space,pcVar1,pcVar1 + color_space->_M_string_length);
  (this->filter)._M_dataplus._M_p = (pointer)&(this->filter).field_2;
  pcVar1 = (filter->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->filter,pcVar1,pcVar1 + filter->_M_string_length);
  this->n_stripes = 6;
  this_00 = &this->stripes;
  (this->stripes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->stripes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->stripes).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->stripes).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  iVar2 = std::__cxx11::string::compare((char *)color_space);
  if (iVar2 == 0) {
    this->j_color_space = JCS_CMYK;
    local_3c = 4;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[5],int>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               &anon_var_dwarf_808e,&local_3c);
    local_3c = 4;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[5],int>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               (char (*) [5])"",&local_3c);
    local_3c = 4;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[5],int>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               (char (*) [5])"",&local_3c);
    local_3c = 4;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[5],int>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               &anon_var_dwarf_80bd,&local_3c);
    local_3c = 4;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[5],int>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               &anon_var_dwarf_80c8,&local_3c);
    local_3c = 4;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[5],int>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               (char (*) [5])"",&local_3c);
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)color_space);
    if (iVar2 == 0) {
      this->j_color_space = JCS_RGB;
      local_3c = 3;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[4],int>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 &anon_var_dwarf_80f7,&local_3c);
      local_3c = 3;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[4],int>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (char (*) [4])"",&local_3c);
      local_3c = 3;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[4],int>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (char (*) [4])"",&local_3c);
      local_3c = 3;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[4],int>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 &anon_var_dwarf_8126,&local_3c);
      local_3c = 3;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[4],int>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 &anon_var_dwarf_8131,&local_3c);
      local_3c = 3;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[4],int>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (char (*) [4])"",&local_3c);
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)color_space);
      if (iVar2 == 0) {
        this->j_color_space = JCS_GRAYSCALE;
        local_3c = 1;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[2],int>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                   &anon_var_dwarf_8152,&local_3c);
        local_3c = 1;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[2],int>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                   &anon_var_dwarf_816b,&local_3c);
        local_3c = 1;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[2],int>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                   &anon_var_dwarf_8176,&local_3c);
        local_3c = 1;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[2],int>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                   (char (*) [2])"f",&local_3c);
        local_3c = 1;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[2],int>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                   (char (*) [2])"3",&local_3c);
        local_3c = 1;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[2],int>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                   (char (*) [2])"",&local_3c);
      }
    }
  }
  return;
}

Assistant:

ImageProvider::ImageProvider(std::string const& color_space, std::string const& filter) :
    color_space(color_space),
    filter(filter)
{
    if (color_space == "/DeviceCMYK") {
        j_color_space = JCS_CMYK;
        stripes.emplace_back("\xff\x00\x00\x00", 4);
        stripes.emplace_back("\x00\xff\x00\x00", 4);
        stripes.emplace_back("\x00\x00\xff\x00", 4);
        stripes.emplace_back("\xff\x00\xff\x00", 4);
        stripes.emplace_back("\xff\xff\x00\x00", 4);
        stripes.emplace_back("\x00\x00\x00\xff", 4);
    } else if (color_space == "/DeviceRGB") {
        j_color_space = JCS_RGB;
        stripes.emplace_back("\xff\x00\x00", 3);
        stripes.emplace_back("\x00\xff\x00", 3);
        stripes.emplace_back("\x00\x00\xff", 3);
        stripes.emplace_back("\xff\x00\xff", 3);
        stripes.emplace_back("\xff\xff\x00", 3);
        stripes.emplace_back("\x00\x00\x00", 3);
    } else if (color_space == "/DeviceGray") {
        j_color_space = JCS_GRAYSCALE;
        stripes.emplace_back("\xee", 1);
        stripes.emplace_back("\xcc", 1);
        stripes.emplace_back("\x99", 1);
        stripes.emplace_back("\x66", 1);
        stripes.emplace_back("\x33", 1);
        stripes.emplace_back("\x00", 1);
    }
}